

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void wpe_process_provider_destroy(wpe_process_provider *provider)

{
  wpe_process_provider *provider_local;
  
  if (provider != (wpe_process_provider *)0x0) {
    if ((provider_interface != (wpe_process_provider_interface *)0x0) &&
       (provider_interface->destroy != (_func_void_void_ptr *)0x0)) {
      (*provider_interface->destroy)(provider);
    }
    provider->backend = (void *)0x0;
    free(provider);
  }
  return;
}

Assistant:

void
wpe_process_provider_destroy(struct wpe_process_provider* provider)
{
    if (!provider)
        return;

    if (provider_interface && provider_interface->destroy)
        provider_interface->destroy(provider);
    provider->backend = NULL;
    free(provider);
}